

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

String * kj::operator*(String *__return_storage_ptr__,void **param_2)

{
  kj *this;
  char *pcVar1;
  ArrayDisposer *pAVar2;
  ArrayPtr<void_*const> trace;
  size_t sVar3;
  Context *c;
  void *pvVar4;
  size_t sVar5;
  code *delim;
  size_t extraout_RDX;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  StringPtr filename;
  char (*params_5) [2];
  String *in_stack_ffffffffffffff08;
  size_t sStack_f0;
  ArrayDisposer *local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  Array<kj::String> contextText;
  ArrayPtr<const_char> local_b8;
  undefined8 *local_a8;
  String local_98;
  String *pSVar10;
  undefined1 local_70 [16];
  char *local_60;
  String local_58;
  char *local_40;
  void *local_38;
  
  pvVar4 = param_2[9];
  uVar8 = 0;
  if (pvVar4 != (void *)0x0) {
    do {
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
      pvVar4 = *(void **)((long)pvVar4 + 0x30);
    } while (pvVar4 != (void *)0x0);
    uVar8 = (ulong)uVar7;
  }
  delim = _::HeapArrayDisposer::Allocate_<kj::String>::construct;
  contextText.ptr =
       (String *)
       _::HeapArrayDisposer::allocateImpl
                 (0x18,uVar8,uVar8,_::HeapArrayDisposer::Allocate_<kj::String>::construct,
                  ArrayDisposer::Dispose_<kj::String>::destruct);
  contextText.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  puVar6 = (undefined8 *)param_2[9];
  contextText.size_ = uVar8;
  if (puVar6 != (undefined8 *)0x0) {
    uVar8 = 0;
    do {
      this = (kj *)*puVar6;
      sVar5 = strlen((char *)this);
      params_5 = (char (*) [2])0x165852;
      filename.content.size_ = extraout_RDX;
      filename.content.ptr = (char *)(sVar5 + 1);
      local_b8 = (ArrayPtr<const_char>)trimSourceFilename(this,filename);
      str<kj::StringPtr,char_const(&)[2],int_const&,char_const(&)[12],kj::String_const&,char_const(&)[2]>
                ((String *)&stack0xffffffffffffff08,(kj *)&local_b8,(StringPtr *)0x1808e4,
                 (char (*) [2])(puVar6 + 1),(int *)": context: ",(char (*) [12])(puVar6 + 2),
                 (String *)0x19350c,params_5);
      pSVar10 = contextText.ptr + uVar8;
      pcVar1 = (pSVar10->content).ptr;
      delim = (code *)contextText.ptr;
      if (pcVar1 != (char *)0x0) {
        delim = (code *)(pSVar10->content).size_;
        pAVar2 = (pSVar10->content).disposer;
        (pSVar10->content).ptr = (char *)0x0;
        (pSVar10->content).size_ = 0;
        (*(code *)**(undefined8 **)pAVar2)(pAVar2,pcVar1,1,delim,delim,0);
      }
      (pSVar10->content).ptr = (char *)in_stack_ffffffffffffff08;
      (pSVar10->content).size_ = sStack_f0;
      (pSVar10->content).disposer = local_e8;
      puVar6 = (undefined8 *)puVar6[6];
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (puVar6 != (undefined8 *)0x0);
  }
  strArray<kj::Array<kj::String>&>
            ((String *)&stack0xffffffffffffff08,(kj *)&contextText,(Array<kj::String> *)0x19350d,
             (char *)delim);
  local_58.content.ptr = (char *)param_2[3];
  local_dc = *(undefined4 *)(param_2 + 4);
  local_e0 = *(undefined4 *)((long)param_2 + 0x24);
  local_38 = param_2[6];
  local_40 = "";
  if (local_38 != (void *)0x0) {
    local_40 = (char *)param_2[5];
  }
  bVar9 = local_38 < (void *)0x2;
  if (bVar9) {
    local_38 = (void *)0x1;
  }
  local_60 = ": ";
  if (bVar9) {
    local_60 = "";
  }
  pAVar2 = (ArrayDisposer *)param_2[0xb];
  local_58.content.size_ = 0x19350d;
  if (pAVar2 != (ArrayDisposer *)0x0) {
    local_58.content.size_ = (size_t)param_2[10];
  }
  local_58.content.disposer = (ArrayDisposer *)0x1;
  if ((ArrayDisposer *)0x1 < pAVar2) {
    local_58.content.disposer = pAVar2;
  }
  local_70._8_8_ = "\nremote: ";
  if ((ArrayDisposer *)0x1 >= pAVar2) {
    local_70._8_8_ = "";
  }
  local_98.content.ptr = (char *)(param_2 + 0xd);
  local_98.content.size_ = (size_t)*(uint *)(param_2 + 0x2d);
  local_70._0_8_ = "\nstack: ";
  if (local_98.content.size_ == 0) {
    local_70._0_8_ = "";
  }
  pSVar10 = __return_storage_ptr__;
  strArray<kj::ArrayPtr<void*const>&>
            ((String *)&local_b8,(kj *)&local_98,(ArrayPtr<void_*const> *)0x191666,
             (char *)local_70._0_8_);
  trace.size_ = (size_t)pSVar10;
  trace.ptr = param_2;
  stringifyStackTrace(trace);
  str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
            (__return_storage_ptr__,(kj *)&stack0xffffffffffffff08,&local_58,(char **)0x1808e4,
             (char (*) [2])&local_dc,(int *)0x1918f7,(char (*) [3])&local_e0,(Type *)&local_60,
             &local_40,(StringPtr *)(local_70 + 8),(char **)&local_58.content.size_,
             (StringPtr *)local_70,&local_b8.ptr,&local_98,in_stack_ffffffffffffff08);
  sVar3 = local_98.content.size_;
  pcVar1 = local_98.content.ptr;
  if ((void **)local_98.content.ptr != (void **)0x0) {
    local_98.content.ptr = (char *)0x0;
    local_98.content.size_ = 0;
    (*(code *)**(undefined8 **)local_98.content.disposer)
              (local_98.content.disposer,pcVar1,1,sVar3,sVar3,0);
  }
  pcVar1 = local_b8.ptr;
  if (local_b8.ptr != (char *)0x0) {
    sVar3 = local_b8.size_;
    local_b8 = (ArrayPtr<const_char>)ZEXT816(0);
    (**(code **)*local_a8)(local_a8,pcVar1,1,sVar3,sVar3,0);
  }
  if (in_stack_ffffffffffffff08 != (String *)0x0) {
    (*(code *)**(undefined8 **)local_e8)(local_e8,in_stack_ffffffffffffff08,1,sStack_f0,sStack_f0,0)
    ;
  }
  sVar3 = contextText.size_;
  pSVar10 = contextText.ptr;
  if (contextText.ptr != (String *)0x0) {
    contextText.ptr = (String *)0x0;
    contextText.size_ = 0;
    (*(code *)**(undefined8 **)contextText.disposer)
              (contextText.disposer,pSVar10,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(const Exception& e) {
  uint contextDepth = 0;

  Maybe<const Exception::Context&> contextPtr = e.getContext();
  for (;;) {
    KJ_IF_SOME(c, contextPtr) {
      ++contextDepth;
      contextPtr = c.next;
    } else {
      break;
    }
  }